

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RectMatrix.hpp
# Opt level: O0

RectMatrix<double,_6U,_6U> * __thiscall
OpenMD::RectMatrix<double,_6U,_6U>::operator=
          (RectMatrix<double,_6U,_6U> *this,RectMatrix<double,_6U,_6U> *m)

{
  uint j;
  uint i;
  RectMatrix<double,_6U,_6U> *m_local;
  RectMatrix<double,_6U,_6U> *this_local;
  
  if (this != m) {
    for (i = 0; i < 6; i = i + 1) {
      for (j = 0; j < 6; j = j + 1) {
        this->data_[i][j] = m->data_[i][j];
      }
    }
  }
  return this;
}

Assistant:

RectMatrix<Real, Row, Col>& operator=(const RectMatrix<Real, Row, Col>& m) {
      if (this == &m) return *this;

      for (unsigned int i = 0; i < Row; i++)
        for (unsigned int j = 0; j < Col; j++)
          this->data_[i][j] = m.data_[i][j];
      return *this;
    }